

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall
NamespaceData::NamespaceData
          (NamespaceData *this,Allocator *allocator,SynBase *source,ScopeData *scope,
          NamespaceData *parent,SynIdentifier *name,uint uniqueId)

{
  uint uVar1;
  SynIdentifier *name_local;
  NamespaceData *parent_local;
  ScopeData *scope_local;
  SynBase *source_local;
  Allocator *allocator_local;
  NamespaceData *this_local;
  
  this->source = source;
  this->scope = scope;
  this->parent = parent;
  SmallArray<NamespaceData_*,_2U>::SmallArray(&this->children,allocator);
  SynIdentifier::SynIdentifier(&this->name,name);
  this->uniqueId = uniqueId;
  uVar1 = InplaceStr::hash(&name->name);
  this->nameHash = uVar1;
  if (parent == (NamespaceData *)0x0) {
    this->fullNameHash = this->nameHash;
  }
  else {
    uVar1 = NULLC::StringHashContinue(parent->fullNameHash,".");
    uVar1 = NULLC::StringHashContinue(uVar1,(name->name).begin,(name->name).end);
    this->fullNameHash = uVar1;
  }
  return;
}

Assistant:

NamespaceData(Allocator *allocator, SynBase *source, ScopeData *scope, NamespaceData *parent, const SynIdentifier& name, unsigned uniqueId): source(source), scope(scope), parent(parent), children(allocator), name(name), uniqueId(uniqueId)
	{
		nameHash = name.name.hash();

		if(parent)
			fullNameHash = NULLC::StringHashContinue(NULLC::StringHashContinue(parent->fullNameHash, "."), name.name.begin, name.name.end);
		else
			fullNameHash = nameHash;
	}